

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_output_variable_initializer(CompilerGLSL *this,SPIRVariable *var)

{
  ID *ts;
  size_t sVar1;
  bool bVar2;
  bool bVar3;
  ExecutionModel EVar4;
  uint32_t uVar5;
  SPIRFunction *pSVar6;
  SPIRType *type;
  ulong count;
  SPIRType *pSVar7;
  SPIRConstant *pSVar8;
  SPIRConstant *pSVar9;
  uint uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  bool bVar12;
  char (*in_R8) [6];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  ulong uVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  bool bVar15;
  char (*in_stack_ffffffffffffeb78) [6];
  uint32_t local_147c;
  undefined1 local_1476;
  undefined1 local_1475;
  uint local_1474;
  CompilerGLSL *local_1470;
  uint local_1468;
  uint local_1464;
  string lut_name;
  string local_1418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13d8;
  string local_13b8;
  SPIRType array_type;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  exprs;
  _Any_data local_1128;
  undefined1 local_1118 [8];
  _Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false> _Stack_1110;
  CompilerGLSL *local_1108;
  CompilerGLSL *pCStack_1100;
  CompilerGLSL *local_10f8;
  Variant *pVStack_10f0;
  Buffer *local_110;
  char local_108 [16];
  Buffer local_f8 [8];
  
  pSVar6 = Variant::get<spirv_cross::SPIRFunction>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      (this->super_Compiler).ir.default_entry_point.id);
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                    *(uint *)&(var->super_IVariant).field_0xc);
  ts = &(var->super_IVariant).self;
  local_1470 = (CompilerGLSL *)var;
  bVar2 = Compiler::has_decoration
                    (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationPatch);
  bVar3 = Compiler::has_decoration
                    (&this->super_Compiler,(ID)(type->super_IVariant).self.id,DecorationBlock);
  EVar4 = Compiler::get_execution_model(&this->super_Compiler);
  bVar15 = EVar4 == ExecutionModelTessellationControl;
  bVar12 = !bVar2;
  local_1475 = bVar12 && bVar15;
  if (bVar3) {
    local_1464 = (uint)(type->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
    sVar1 = (type->array).super_VectorView<unsigned_int>.buffer_size;
    local_1474 = 1;
    local_1468 = 1;
    local_1476 = sVar1 == 1;
    if ((bool)local_1476) {
      local_1468 = to_array_size_literal(this,type,0);
    }
    if (!bVar12 || !bVar15) {
      local_1474 = local_1468;
    }
    local_147c = 0;
    if (local_1464 == 0) {
      return;
    }
    count = (ulong)local_1468;
    do {
      bVar3 = Compiler::has_member_decoration
                        (&this->super_Compiler,(TypeID)(type->super_IVariant).self.id,local_147c,
                         DecorationBuiltIn);
      if ((!bVar3) ||
         (((uVar5 = Compiler::get_member_decoration
                              (&this->super_Compiler,(TypeID)(type->super_IVariant).self.id,
                               local_147c,DecorationBuiltIn), uVar5 != 4 ||
           ((this->super_Compiler).cull_distance_count != 0)) &&
          ((uVar5 = Compiler::get_member_decoration
                              (&this->super_Compiler,(TypeID)(type->super_IVariant).self.id,
                               local_147c,DecorationBuiltIn), uVar5 != 3 ||
           ((this->super_Compiler).clip_distance_count != 0)))))) {
        lut_name._M_dataplus._M_p = (pointer)&lut_name.field_2;
        lut_name._M_string_length = 0;
        lut_name.field_2._M_local_buf[0] = '\0';
        if (sVar1 == 1) {
          join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[2],unsigned_int&,char_const(&)[6]>
                    ((string *)&local_1128,(spirv_cross *)0x366a8c,(char (*) [2])ts,
                     (TypedID<(spirv_cross::Types)0> *)0x366a8c,(char (*) [2])&local_147c,
                     (uint *)"_init",in_stack_ffffffffffffeb78);
          ::std::__cxx11::string::operator=((string *)&lut_name,(string *)local_1128._M_pod_data);
          if ((CompilerGLSL *)local_1128._M_unused._0_8_ != (CompilerGLSL *)local_1118) {
            operator_delete(local_1128._M_unused._M_object);
          }
          pSVar7 = Variant::get<spirv_cross::SPIRType>
                             ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                              ptr + *(uint *)((long)&(local_1470->super_Compiler).ir.pool_group._M_t
                                                     .
                                                  super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                                                  .
                                                  super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>
                                                  ._M_head_impl + 4));
          uVar10 = (pSVar7->member_types).
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[local_147c].id
          ;
          pSVar7 = Variant::get<spirv_cross::SPIRType>
                             ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                              ptr + uVar10);
          SPIRType::SPIRType(&array_type,pSVar7);
          array_type.parent_type.id = uVar10;
          SmallVector<unsigned_int,_8UL>::reserve
                    (&array_type.array,
                     array_type.array.super_VectorView<unsigned_int>.buffer_size + 1);
          uVar10 = local_1468;
          array_type.array.super_VectorView<unsigned_int>.ptr
          [array_type.array.super_VectorView<unsigned_int>.buffer_size] = local_1468;
          array_type.array.super_VectorView<unsigned_int>.buffer_size =
               array_type.array.super_VectorView<unsigned_int>.buffer_size + 1;
          SmallVector<bool,_8UL>::reserve
                    (&array_type.array_size_literal,
                     array_type.array_size_literal.super_VectorView<bool>.buffer_size + 1);
          array_type.array_size_literal.super_VectorView<bool>.ptr
          [array_type.array_size_literal.super_VectorView<bool>.buffer_size] = true;
          array_type.array_size_literal.super_VectorView<bool>.buffer_size =
               array_type.array_size_literal.super_VectorView<bool>.buffer_size + 1;
          exprs.
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .buffer_size = 0;
          exprs.
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &exprs.stack_storage;
          exprs.buffer_capacity = 8;
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::reserve(&exprs,count);
          pSVar8 = Variant::get<spirv_cross::SPIRConstant>
                             ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                              ptr + *(uint *)&(local_1470->super_Compiler).ir.spirv.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish);
          if (uVar10 != 0) {
            uVar13 = 0;
            do {
              pSVar9 = Variant::get<spirv_cross::SPIRConstant>
                                 ((this->super_Compiler).ir.ids.
                                  super_VectorView<spirv_cross::Variant>.ptr +
                                  (pSVar8->subconstants).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr
                                  [uVar13].id);
              to_expression_abi_cxx11_
                        ((string *)&local_1128,this,
                         (pSVar9->subconstants).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr
                         [local_147c].id,true);
              SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
              ::push_back(&exprs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_1128);
              if ((CompilerGLSL *)local_1128._M_unused._0_8_ != (CompilerGLSL *)local_1118) {
                operator_delete(local_1128._M_unused._M_object);
              }
              uVar13 = uVar13 + 1;
            } while (count != uVar13);
          }
          (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_13d8,this,&array_type,0);
          (*(this->super_Compiler)._vptr_Compiler[0x26])(&local_13f8,this,&array_type);
          type_to_glsl_constructor_abi_cxx11_(&local_1418,this,&array_type);
          local_1118 = (undefined1  [8])0x0;
          local_1128._M_unused._M_object = (CompilerGLSL *)0x0;
          local_1128._8_8_ = (CompilerGLSL *)0x0;
          local_108[0] = '\0';
          local_108[1] = '\0';
          local_108[2] = '\0';
          local_108[3] = '\0';
          local_108[4] = '\0';
          local_108[5] = '\0';
          local_108[6] = '\0';
          local_108[7] = '\0';
          local_110 = local_f8;
          local_108[8] = '\b';
          local_108[9] = '\0';
          local_108[10] = '\0';
          local_108[0xb] = '\0';
          local_108[0xc] = '\0';
          local_108[0xd] = '\0';
          local_108[0xe] = '\0';
          local_108[0xf] = '\0';
          StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)&local_1128);
          if (exprs.
              super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .buffer_size != 0) {
            pbVar11 = exprs.
                      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .ptr + exprs.
                             super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .buffer_size;
            pbVar14 = exprs.
                      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .ptr;
            do {
              StringStream<4096UL,_4096UL>::append
                        ((StringStream<4096UL,_4096UL> *)&local_1128,(pbVar14->_M_dataplus)._M_p,
                         pbVar14->_M_string_length);
              if (pbVar14 !=
                  exprs.
                  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .ptr + (exprs.
                          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .buffer_size - 1)) {
                StringStream<4096UL,_4096UL>::append
                          ((StringStream<4096UL,_4096UL> *)&local_1128,", ",2);
              }
              pbVar14 = pbVar14 + 1;
            } while (pbVar14 != pbVar11);
          }
          StringStream<4096ul,4096ul>::str_abi_cxx11_(&local_13b8,&local_1128);
          StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)&local_1128);
          statement<char_const(&)[7],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3]>
                    (this,(char (*) [7])0x36d9d5,&local_13d8,(char (*) [2])0x362d7b,&lut_name,
                     &local_13f8,(char (*) [4])0x37984e,&local_1418,(char (*) [2])0x379f10,
                     &local_13b8,(char (*) [3])0x361553);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_13b8._M_dataplus._M_p != &local_13b8.field_2) {
            operator_delete(local_13b8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1418._M_dataplus._M_p != &local_1418.field_2) {
            operator_delete(local_1418._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_13f8._M_dataplus._M_p != &local_13f8.field_2) {
            operator_delete(local_13f8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_13d8._M_dataplus._M_p != &local_13d8.field_2) {
            operator_delete(local_13d8._M_dataplus._M_p);
          }
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::~SmallVector(&exprs);
          array_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003f9270;
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&array_type.member_name_cache._M_h);
          array_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
          if ((AlignedBuffer<unsigned_int,_8UL> *)
              array_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
              &array_type.member_type_index_redirection.stack_storage) {
            free(array_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
          }
          array_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          buffer_size = 0;
          if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
              array_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
              .ptr != &array_type.member_types.stack_storage) {
            free(array_type.member_types.
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
          }
          array_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
          if ((AlignedBuffer<bool,_8UL> *)array_type.array_size_literal.super_VectorView<bool>.ptr
              != &array_type.array_size_literal.stack_storage) {
            free(array_type.array_size_literal.super_VectorView<bool>.ptr);
          }
          array_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
          if ((AlignedBuffer<unsigned_int,_8UL> *)
              array_type.array.super_VectorView<unsigned_int>.ptr != &array_type.array.stack_storage
             ) {
            free(array_type.array.super_VectorView<unsigned_int>.ptr);
          }
        }
        if (local_1474 != 0) {
          uVar10 = 0;
          do {
            local_1128._M_unused._M_object = local_1470;
            local_1118[0] = local_1475;
            local_1118._4_4_ = local_147c;
            _Stack_1110._M_head_impl._1_1_ = local_1476;
            _Stack_1110._M_head_impl._0_1_ = bVar2;
            _Stack_1110._M_head_impl._4_4_ = uVar10;
            local_1128._8_8_ = this;
            local_1108 = (CompilerGLSL *)&local_10f8;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1108,lut_name._M_dataplus._M_p,
                       lut_name._M_dataplus._M_p + lut_name._M_string_length);
            array_type.width = 0;
            array_type.vecsize = 0;
            array_type.columns = 0;
            array_type._28_4_ = 0;
            array_type.super_IVariant._vptr_IVariant = (_func_int **)0x0;
            array_type.super_IVariant.self.id = 0;
            array_type.super_IVariant._12_4_ = 0;
            array_type.super_IVariant._vptr_IVariant = (_func_int **)operator_new(0x40);
            array_type.super_IVariant._vptr_IVariant[2] = (_func_int *)local_1118;
            array_type.super_IVariant._vptr_IVariant[3] = (_func_int *)_Stack_1110._M_head_impl;
            *array_type.super_IVariant._vptr_IVariant = (_func_int *)local_1128._M_unused._0_8_;
            array_type.super_IVariant._vptr_IVariant[1] = (_func_int *)local_1128._8_8_;
            array_type.super_IVariant._vptr_IVariant[4] =
                 (_func_int *)(array_type.super_IVariant._vptr_IVariant + 6);
            if (local_1108 == (CompilerGLSL *)&local_10f8) {
              array_type.super_IVariant._vptr_IVariant[6] = (_func_int *)local_10f8;
              array_type.super_IVariant._vptr_IVariant[7] = (_func_int *)pVStack_10f0;
            }
            else {
              array_type.super_IVariant._vptr_IVariant[4] = (_func_int *)local_1108;
              array_type.super_IVariant._vptr_IVariant[6] = (_func_int *)local_10f8;
            }
            array_type.super_IVariant._vptr_IVariant[5] = (_func_int *)pCStack_1100;
            pCStack_1100 = (CompilerGLSL *)0x0;
            local_10f8 = (CompilerGLSL *)((ulong)local_10f8 & 0xffffffffffffff00);
            array_type._24_8_ =
                 ::std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_glsl.cpp:3904:41)>
                 ::_M_invoke;
            array_type._16_8_ =
                 ::std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_glsl.cpp:3904:41)>
                 ::_M_manager;
            local_1108 = (CompilerGLSL *)&local_10f8;
            SmallVector<std::function<void_()>,_0UL>::push_back
                      (&pSVar6->fixup_hooks_in,(function<void_()> *)&array_type);
            if (array_type._16_8_ != 0) {
              (*(code *)array_type._16_8_)(&array_type,&array_type,3);
            }
            if (local_1108 != (CompilerGLSL *)&local_10f8) {
              operator_delete(local_1108);
            }
            uVar10 = uVar10 + 1;
          } while (local_1474 != uVar10);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)lut_name._M_dataplus._M_p != &lut_name.field_2) {
          operator_delete(lut_name._M_dataplus._M_p);
        }
      }
      local_147c = local_147c + 1;
    } while (local_147c < local_1464);
    return;
  }
  if (bVar12 && bVar15) {
    join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[6]>
              ((string *)&array_type,(spirv_cross *)0x366a8c,(char (*) [2])ts,
               (TypedID<(spirv_cross::Types)0> *)"_init",in_R8);
    (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_1128,this,type,0);
    (*(this->super_Compiler)._vptr_Compiler[0x26])(&exprs,this,type);
    to_expression_abi_cxx11_
              (&lut_name,this,
               *(uint32_t *)
                &(local_1470->super_Compiler).ir.spirv.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,true);
    statement<char_const(&)[7],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (this,(char (*) [7])0x36d9d5,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1128,
               (char (*) [2])0x362d7b,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&array_type,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exprs,
               (char (*) [4])0x37984e,&lut_name,(char (*) [2])0x361554);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)lut_name._M_dataplus._M_p != &lut_name.field_2) {
      operator_delete(lut_name._M_dataplus._M_p);
    }
    if (exprs.
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &exprs.buffer_capacity) {
      operator_delete(exprs.
                      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .ptr);
    }
    if ((CompilerGLSL *)local_1128._M_unused._0_8_ != (CompilerGLSL *)local_1118) {
      operator_delete(local_1128._M_unused._M_object);
    }
    local_1128._M_unused._M_object = (CompilerGLSL *)local_1118;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1128,array_type.super_IVariant._vptr_IVariant,
               array_type.super_IVariant._8_8_ + (long)array_type.super_IVariant._vptr_IVariant);
    pCStack_1100 = local_1470;
    exprs.
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .buffer_size = 0;
    local_1108 = this;
    exprs.
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x30);
    ((exprs.
      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     .ptr)->_M_dataplus)._M_p =
         (pointer)&(exprs.
                    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .ptr)->field_2;
    if ((CompilerGLSL *)local_1128._M_unused._0_8_ == (CompilerGLSL *)local_1118) {
      ((exprs.
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .ptr)->field_2)._M_allocated_capacity = (size_type)local_1118;
      *(ObjectPoolGroup **)
       ((long)&(exprs.
                super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .ptr)->field_2 + 8) = _Stack_1110._M_head_impl;
    }
    else {
      ((exprs.
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .ptr)->_M_dataplus)._M_p = (pointer)local_1128._M_unused._0_8_;
      ((exprs.
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .ptr)->field_2)._M_allocated_capacity = (size_type)local_1118;
    }
    (exprs.
     super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .ptr)->_M_string_length = local_1128._8_8_;
    local_1128._8_8_ = 0;
    local_1118 = (undefined1  [8])((ulong)local_1118 & 0xffffffffffffff00);
    exprs.
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .ptr[1]._M_dataplus._M_p = (pointer)local_1108;
    exprs.
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .ptr[1]._M_string_length = (size_type)pCStack_1100;
    exprs.stack_storage.aligned_char._0_8_ =
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_glsl.cpp:3959:39)>
         ::_M_invoke;
    exprs.buffer_capacity =
         (size_t)::std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_glsl.cpp:3959:39)>
                 ::_M_manager;
    local_1128._M_unused._0_8_ = (CompilerGLSL *)local_1118;
    SmallVector<std::function<void_()>,_0UL>::push_back
              (&pSVar6->fixup_hooks_in,(function<void_()> *)&exprs);
    if (exprs.buffer_capacity != 0) {
      (*(code *)exprs.buffer_capacity)(&exprs,&exprs,3);
    }
    if ((CompilerGLSL *)local_1128._M_unused._0_8_ != (CompilerGLSL *)local_1118) {
      operator_delete(local_1128._M_unused._M_object);
    }
    if (array_type.super_IVariant._vptr_IVariant == (_func_int **)&array_type.width) {
      return;
    }
  }
  else {
    bVar3 = Compiler::has_decoration(&this->super_Compiler,(ID)ts->id,DecorationBuiltIn);
    if ((bVar3) &&
       (uVar5 = Compiler::get_decoration(&this->super_Compiler,(ID)ts->id,DecorationBuiltIn),
       uVar5 == 0x14)) {
      local_1128._8_8_ = local_1470;
      _Stack_1110._M_head_impl =
           (ObjectPoolGroup *)
           ::std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_glsl.cpp:3967:39)>
           ::_M_invoke;
      local_1118 = (undefined1  [8])
                   ::std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_glsl.cpp:3967:39)>
                   ::_M_manager;
      local_1128._M_unused._M_object = this;
      SmallVector<std::function<void_()>,_0UL>::push_back
                (&pSVar6->fixup_hooks_in,(function<void_()> *)&local_1128);
      if (local_1118 == (undefined1  [8])0x0) {
        return;
      }
      (*(code *)local_1118)(&local_1128,&local_1128,3);
      return;
    }
    join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[6]>
              ((string *)&array_type,(spirv_cross *)0x366a8c,(char (*) [2])ts,
               (TypedID<(spirv_cross::Types)0> *)"_init",in_R8);
    (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_1128,this,type,0);
    (*(this->super_Compiler)._vptr_Compiler[0x26])(&exprs,this,type);
    to_expression_abi_cxx11_
              (&lut_name,this,
               *(uint32_t *)
                &(local_1470->super_Compiler).ir.spirv.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,true);
    statement<char_const(&)[7],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (this,(char (*) [7])0x36d9d5,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1128,
               (char (*) [2])0x362d7b,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&array_type,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exprs,
               (char (*) [4])0x37984e,&lut_name,(char (*) [2])0x361554);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)lut_name._M_dataplus._M_p != &lut_name.field_2) {
      operator_delete(lut_name._M_dataplus._M_p);
    }
    if (exprs.
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &exprs.buffer_capacity) {
      operator_delete(exprs.
                      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .ptr);
    }
    if ((CompilerGLSL *)local_1128._M_unused._0_8_ != (CompilerGLSL *)local_1118) {
      operator_delete(local_1128._M_unused._M_object);
    }
    local_1128._M_unused._M_object = (CompilerGLSL *)local_1118;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1128,array_type.super_IVariant._vptr_IVariant,
               array_type.super_IVariant._8_8_ + (long)array_type.super_IVariant._vptr_IVariant);
    local_1108 = (CompilerGLSL *)CONCAT71(local_1108._1_7_,bVar2);
    local_10f8 = local_1470;
    exprs.
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .buffer_size = 0;
    pCStack_1100 = this;
    exprs.
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x38);
    ((exprs.
      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     .ptr)->_M_dataplus)._M_p =
         (pointer)&(exprs.
                    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .ptr)->field_2;
    if ((CompilerGLSL *)local_1128._M_unused._0_8_ == (CompilerGLSL *)local_1118) {
      ((exprs.
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .ptr)->field_2)._M_allocated_capacity = (size_type)local_1118;
      *(ObjectPoolGroup **)
       ((long)&(exprs.
                super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .ptr)->field_2 + 8) = _Stack_1110._M_head_impl;
    }
    else {
      ((exprs.
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .ptr)->_M_dataplus)._M_p = (pointer)local_1128._M_unused._0_8_;
      ((exprs.
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .ptr)->field_2)._M_allocated_capacity = (size_type)local_1118;
    }
    (exprs.
     super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .ptr)->_M_string_length = local_1128._8_8_;
    local_1128._8_8_ = 0;
    local_1118 = (undefined1  [8])((ulong)local_1118 & 0xffffffffffffff00);
    exprs.
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .ptr[1].field_2._M_allocated_capacity = (size_type)local_10f8;
    exprs.
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .ptr[1]._M_dataplus._M_p = (pointer)local_1108;
    exprs.
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .ptr[1]._M_string_length = (size_type)pCStack_1100;
    exprs.stack_storage.aligned_char._0_8_ =
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_glsl.cpp:3983:39)>
         ::_M_invoke;
    exprs.buffer_capacity =
         (size_t)::std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_glsl.cpp:3983:39)>
                 ::_M_manager;
    local_1128._M_unused._0_8_ = (CompilerGLSL *)local_1118;
    SmallVector<std::function<void_()>,_0UL>::push_back
              (&pSVar6->fixup_hooks_in,(function<void_()> *)&exprs);
    if (exprs.buffer_capacity != 0) {
      (*(code *)exprs.buffer_capacity)(&exprs,&exprs,3);
    }
    if ((CompilerGLSL *)local_1128._M_unused._0_8_ != (CompilerGLSL *)local_1118) {
      operator_delete(local_1128._M_unused._M_object);
    }
    if (array_type.super_IVariant._vptr_IVariant == (_func_int **)&array_type.width) {
      return;
    }
  }
  operator_delete(array_type.super_IVariant._vptr_IVariant);
  return;
}

Assistant:

void CompilerGLSL::emit_output_variable_initializer(const SPIRVariable &var)
{
	// If a StorageClassOutput variable has an initializer, we need to initialize it in main().
	auto &entry_func = this->get<SPIRFunction>(ir.default_entry_point);
	auto &type = get<SPIRType>(var.basetype);
	bool is_patch = has_decoration(var.self, DecorationPatch);
	bool is_block = has_decoration(type.self, DecorationBlock);
	bool is_control_point = get_execution_model() == ExecutionModelTessellationControl && !is_patch;

	if (is_block)
	{
		uint32_t member_count = uint32_t(type.member_types.size());
		bool type_is_array = type.array.size() == 1;
		uint32_t array_size = 1;
		if (type_is_array)
			array_size = to_array_size_literal(type);
		uint32_t iteration_count = is_control_point ? 1 : array_size;

		// If the initializer is a block, we must initialize each block member one at a time.
		for (uint32_t i = 0; i < member_count; i++)
		{
			// These outputs might not have been properly declared, so don't initialize them in that case.
			if (has_member_decoration(type.self, i, DecorationBuiltIn))
			{
				if (get_member_decoration(type.self, i, DecorationBuiltIn) == BuiltInCullDistance &&
				    !cull_distance_count)
					continue;

				if (get_member_decoration(type.self, i, DecorationBuiltIn) == BuiltInClipDistance &&
				    !clip_distance_count)
					continue;
			}

			// We need to build a per-member array first, essentially transposing from AoS to SoA.
			// This code path hits when we have an array of blocks.
			string lut_name;
			if (type_is_array)
			{
				lut_name = join("_", var.self, "_", i, "_init");
				uint32_t member_type_id = get<SPIRType>(var.basetype).member_types[i];
				auto &member_type = get<SPIRType>(member_type_id);
				auto array_type = member_type;
				array_type.parent_type = member_type_id;
				array_type.array.push_back(array_size);
				array_type.array_size_literal.push_back(true);

				SmallVector<string> exprs;
				exprs.reserve(array_size);
				auto &c = get<SPIRConstant>(var.initializer);
				for (uint32_t j = 0; j < array_size; j++)
					exprs.push_back(to_expression(get<SPIRConstant>(c.subconstants[j]).subconstants[i]));
				statement("const ", type_to_glsl(array_type), " ", lut_name, type_to_array_glsl(array_type), " = ",
				          type_to_glsl_constructor(array_type), "(", merge(exprs, ", "), ");");
			}

			for (uint32_t j = 0; j < iteration_count; j++)
			{
				entry_func.fixup_hooks_in.push_back([=, &var]() {
					AccessChainMeta meta;
					auto &c = this->get<SPIRConstant>(var.initializer);

					uint32_t invocation_id = 0;
					uint32_t member_index_id = 0;
					if (is_control_point)
					{
						uint32_t ids = ir.increase_bound_by(3);
						SPIRType uint_type;
						uint_type.basetype = SPIRType::UInt;
						uint_type.width = 32;
						set<SPIRType>(ids, uint_type);
						set<SPIRExpression>(ids + 1, builtin_to_glsl(BuiltInInvocationId, StorageClassInput), ids, true);
						set<SPIRConstant>(ids + 2, ids, i, false);
						invocation_id = ids + 1;
						member_index_id = ids + 2;
					}

					if (is_patch)
					{
						statement("if (gl_InvocationID == 0)");
						begin_scope();
					}

					if (type_is_array && !is_control_point)
					{
						uint32_t indices[2] = { j, i };
						auto chain = access_chain_internal(var.self, indices, 2, ACCESS_CHAIN_INDEX_IS_LITERAL_BIT, &meta);
						statement(chain, " = ", lut_name, "[", j, "];");
					}
					else if (is_control_point)
					{
						uint32_t indices[2] = { invocation_id, member_index_id };
						auto chain = access_chain_internal(var.self, indices, 2, 0, &meta);
						statement(chain, " = ", lut_name, "[", builtin_to_glsl(BuiltInInvocationId, StorageClassInput), "];");
					}
					else
					{
						auto chain =
								access_chain_internal(var.self, &i, 1, ACCESS_CHAIN_INDEX_IS_LITERAL_BIT, &meta);
						statement(chain, " = ", to_expression(c.subconstants[i]), ";");
					}

					if (is_patch)
						end_scope();
				});
			}
		}
	}
	else if (is_control_point)
	{
		auto lut_name = join("_", var.self, "_init");
		statement("const ", type_to_glsl(type), " ", lut_name, type_to_array_glsl(type),
		          " = ", to_expression(var.initializer), ";");
		entry_func.fixup_hooks_in.push_back([&, lut_name]() {
			statement(to_expression(var.self), "[gl_InvocationID] = ", lut_name, "[gl_InvocationID];");
		});
	}
	else if (has_decoration(var.self, DecorationBuiltIn) &&
	         BuiltIn(get_decoration(var.self, DecorationBuiltIn)) == BuiltInSampleMask)
	{
		// We cannot copy the array since gl_SampleMask is unsized in GLSL. Unroll time! <_<
		entry_func.fixup_hooks_in.push_back([&] {
			auto &c = this->get<SPIRConstant>(var.initializer);
			uint32_t num_constants = uint32_t(c.subconstants.size());
			for (uint32_t i = 0; i < num_constants; i++)
			{
				// Don't use to_expression on constant since it might be uint, just fish out the raw int.
				statement(to_expression(var.self), "[", i, "] = ",
				          convert_to_string(this->get<SPIRConstant>(c.subconstants[i]).scalar_i32()), ";");
			}
		});
	}
	else
	{
		auto lut_name = join("_", var.self, "_init");
		statement("const ", type_to_glsl(type), " ", lut_name,
		          type_to_array_glsl(type), " = ", to_expression(var.initializer), ";");
		entry_func.fixup_hooks_in.push_back([&, lut_name, is_patch]() {
			if (is_patch)
			{
				statement("if (gl_InvocationID == 0)");
				begin_scope();
			}
			statement(to_expression(var.self), " = ", lut_name, ";");
			if (is_patch)
				end_scope();
		});
	}
}